

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v6::detail::arg_formatter_base<fmt::v6::buffer_range<char>,_fmt::v6::detail::error_handler>::
char_spec_handler::on_int(char_spec_handler *this)

{
  ulong uVar1;
  char cVar2;
  arg_formatter_base<fmt::v6::buffer_range<char>,_fmt::v6::detail::error_handler> *this_00;
  buffer<char> *pbVar3;
  size_t sVar4;
  buffer<char> *c;
  
  this_00 = this->formatter;
  cVar2 = this->value;
  if (this_00->specs_ != (format_specs *)0x0) {
    write_int<int>(this_00,(int)cVar2,this_00->specs_);
    return;
  }
  pbVar3 = (this_00->out_).container;
  sVar4 = pbVar3->size_;
  uVar1 = sVar4 + 1;
  if (pbVar3->capacity_ < uVar1) {
    (**pbVar3->_vptr_buffer)(pbVar3,uVar1);
  }
  pbVar3->size_ = uVar1;
  pbVar3->ptr_[sVar4] = cVar2;
  return;
}

Assistant:

void on_int() {
      if (formatter.specs_)
        formatter.write_int(static_cast<int>(value), *formatter.specs_);
      else
        formatter.write(value);
    }